

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-client.c
# Opt level: O1

int lws_tls_client_vhost_extra_cert_mem(lws_vhost *vh,uint8_t *der,size_t der_len)

{
  int iVar1;
  X509 *x;
  X509_STORE *ctx;
  uint uVar2;
  uint8_t *local_20;
  
  local_20 = der;
  x = d2i_X509((X509 **)0x0,&local_20,der_len);
  if (x == (X509 *)0x0) {
    uVar2 = 1;
    _lws_log(1,"%s: Failed to load DER\n","lws_tls_client_vhost_extra_cert_mem");
    lws_tls_err_describe_clear();
  }
  else {
    ctx = SSL_CTX_get_cert_store((SSL_CTX *)(vh->tls).ssl_client_ctx);
    if (ctx == (X509_STORE *)0x0) {
      uVar2 = 1;
      _lws_log(1,"%s: failed to get cert store\n","lws_tls_client_vhost_extra_cert_mem");
    }
    else {
      iVar1 = X509_STORE_add_cert(ctx,x);
      if (iVar1 != 1) {
        _lws_log(1,"%s: failed to add cert\n","lws_tls_client_vhost_extra_cert_mem");
      }
      uVar2 = (uint)(iVar1 != 1);
    }
    X509_free(x);
  }
  return uVar2;
}

Assistant:

int
lws_tls_client_vhost_extra_cert_mem(struct lws_vhost *vh,
                const uint8_t *der, size_t der_len)
{
	X509_STORE *st;
	X509 *x  = d2i_X509(NULL, &der, (long)der_len);
	int n;

	if (!x) {
		lwsl_err("%s: Failed to load DER\n", __func__);
		lws_tls_err_describe_clear();
		return 1;
	}

	st = SSL_CTX_get_cert_store(vh->tls.ssl_client_ctx);
	if (!st) {
		lwsl_err("%s: failed to get cert store\n", __func__);
		X509_free(x);
		return 1;
	}

	n = X509_STORE_add_cert(st, x);
	if (n != 1)
		lwsl_err("%s: failed to add cert\n", __func__);

	X509_free(x);

	return n != 1;
}